

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O3

SQInteger array_extend(HSQUIRRELVM v)

{
  SQArray *this;
  SQObjectPtr *pSVar1;
  
  pSVar1 = SQVM::GetAt(v,v->_stackbase);
  this = (pSVar1->super_SQObject)._unVal.pArray;
  pSVar1 = SQVM::GetAt(v,v->_stackbase + 1);
  SQArray::Extend(this,(pSVar1->super_SQObject)._unVal.pArray);
  sq_pop(v,1);
  return 1;
}

Assistant:

static SQInteger array_extend(HSQUIRRELVM v)
{
    _array(stack_get(v,1))->Extend(_array(stack_get(v,2)));
    sq_pop(v,1);
    return 1;
}